

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_writer_init_growable(mpack_writer_t *writer,char **target_data,size_t *target_size)

{
  char *pcVar1;
  
  *target_data = (char *)0x0;
  *target_size = 0;
  writer->reserved[0] = target_data;
  writer->reserved[1] = target_size;
  pcVar1 = (char *)malloc(0x1000);
  writer->version = mpack_version_current;
  if (pcVar1 == (char *)0x0) {
    writer->buffer = (char *)0x0;
    writer->current = (char *)0x0;
    writer->teardown = (mpack_writer_teardown_t)0x0;
    writer->context = (void *)0x0;
    writer->flush = (mpack_writer_flush_t)0x0;
    writer->error_fn = (mpack_writer_error_t)0x0;
    writer->end = (char *)0x0;
    writer->error = mpack_error_memory;
  }
  else {
    *(undefined8 *)((long)&writer->current + 4) = 0;
    *(undefined8 *)((long)&writer->end + 4) = 0;
    writer->buffer = (char *)0x0;
    writer->current = (char *)0x0;
    writer->teardown = (mpack_writer_teardown_t)0x0;
    writer->context = (void *)0x0;
    writer->flush = (mpack_writer_flush_t)0x0;
    writer->error_fn = (mpack_writer_error_t)0x0;
    writer->buffer = pcVar1;
    writer->current = pcVar1;
    writer->end = pcVar1 + 0x1000;
    mpack_writer_set_flush(writer,mpack_growable_writer_flush);
    writer->teardown = mpack_growable_writer_teardown;
  }
  return;
}

Assistant:

void mpack_writer_init_growable(mpack_writer_t* writer, char** target_data, size_t* target_size) {
    mpack_assert(target_data != NULL, "cannot initialize writer without a destination for the data");
    mpack_assert(target_size != NULL, "cannot initialize writer without a destination for the size");

    *target_data = NULL;
    *target_size = 0;

    MPACK_STATIC_ASSERT(sizeof(mpack_growable_writer_t) <= sizeof(writer->reserved),
            "not enough reserved space for growable writer!");
    mpack_growable_writer_t* growable_writer = (mpack_growable_writer_t*)mpack_writer_get_reserved(writer);

    growable_writer->target_data = target_data;
    growable_writer->target_size = target_size;

    size_t capacity = MPACK_BUFFER_SIZE;
    char* buffer = (char*)MPACK_MALLOC(capacity);
    if (buffer == NULL) {
        mpack_writer_init_error(writer, mpack_error_memory);
        return;
    }

    mpack_writer_init(writer, buffer, capacity);
    mpack_writer_set_flush(writer, mpack_growable_writer_flush);
    mpack_writer_set_teardown(writer, mpack_growable_writer_teardown);
}